

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

int uv__is_cifs_or_smb(int fd)

{
  int iVar1;
  undefined1 local_88 [8];
  statfs s;
  int fd_local;
  
  s.f_spare[3]._0_4_ = fd;
  iVar1 = fstatfs64(fd,(statfs64 *)local_88);
  if (iVar1 == -1) {
    s.f_spare[3]._4_4_ = 0;
  }
  else if (((local_88._0_4_ == -0x1acb2be) || (local_88._0_4_ == -0xacb2be)) ||
          (local_88._0_4_ == 0x517b)) {
    s.f_spare[3]._4_4_ = 1;
  }
  else {
    s.f_spare[3]._4_4_ = 0;
  }
  return s.f_spare[3]._4_4_;
}

Assistant:

static int uv__is_cifs_or_smb(int fd) {
  struct statfs s;

  if (-1 == fstatfs(fd, &s))
    return 0;

  switch ((unsigned) s.f_type) {
  case 0x0000517Bu:  /* SMB */
  case 0xFE534D42u:  /* SMB2 */
  case 0xFF534D42u:  /* CIFS */
    return 1;
  }

  return 0;
}